

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scgi_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::scgi::set_response_headers(scgi *this,response_headers *hdr)

{
  long in_RDI;
  response_headers *in_stack_00000020;
  string local_30 [48];
  
  connection::format_xcgi_response_headers_abi_cxx11_((connection *)hdr,in_stack_00000020);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x148),local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined1 *)(in_RDI + 0x168) = 0;
  return;
}

Assistant:

virtual void set_response_headers(cppcms::impl::response_headers &hdr)
		{
			headers_ = std::move(format_xcgi_response_headers(hdr));
			headers_written_ = false;
		}